

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

bech32_error bech32_stripUnknownChars(char *dst,size_t dstlen,char *src,size_t srclen)

{
  size_t sVar1;
  bech32_error bVar2;
  unsigned_long __n2;
  string inputStr;
  string result;
  string local_70;
  string local_50;
  
  bVar2 = E_BECH32_NULL_ARGUMENT;
  if ((dst != (char *)0x0 && src != (char *)0x0) &&
     (bVar2 = E_BECH32_LENGTH_TOO_SHORT, dstlen <= srclen)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    sVar1 = strlen(src);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,src,src + sVar1);
    bech32::stripUnknownChars(&local_50,&local_70);
    bVar2 = E_BECH32_LENGTH_TOO_SHORT;
    if (local_50._M_string_length + 1 <= dstlen) {
      if (local_50._M_string_length != 0) {
        memmove(dst,local_50._M_dataplus._M_p,local_50._M_string_length);
      }
      dst[local_50._M_string_length] = '\0';
      bVar2 = E_BECH32_SUCCESS;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar2;
}

Assistant:

bech32_error bech32_stripUnknownChars(
        char *dst, size_t dstlen,
        const char *src, size_t srclen) {

    if(src == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(dst == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(dstlen > srclen)
        return E_BECH32_LENGTH_TOO_SHORT;

    std::string inputStr(src);
    std::string result = bech32::stripUnknownChars(inputStr);
    if(dstlen < result.size()+1)
        return E_BECH32_LENGTH_TOO_SHORT;

    std::copy_n(result.begin(), result.size(), dst);
    dst[result.size()] = '\0';

    return E_BECH32_SUCCESS;
}